

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfindrep.h
# Opt level: O0

void __thiscall re_replace_arg::search(re_replace_arg *this,char *str,int start_idx,char *last_str)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  char *__s1;
  int *result_len;
  size_t in_RCX;
  int in_EDX;
  long lVar4;
  size_t in_RSI;
  re_compiled_pattern *in_RDI;
  size_t unaff_retaddr;
  char *in_stack_00000008;
  size_t ml;
  size_t pat_len;
  size_t rem;
  utf8_ptr p;
  char *in_stack_ffffffffffffff88;
  utf8_ptr *in_stack_ffffffffffffff90;
  size_t *in_stack_ffffffffffffff98;
  utf8_ptr *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  CRegexSearcherSimple *in_stack_ffffffffffffffc0;
  utf8_ptr local_28;
  size_t local_20;
  undefined4 in_stack_ffffffffffffffe8;
  re_compiled_pattern *b;
  
  lVar4._0_4_ = (in_RDI->super_re_compiled_pattern_base).tuple_cnt;
  lVar4._4_4_ = (in_RDI->super_re_compiled_pattern_base).group_cnt;
  local_20 = in_RCX;
  if (lVar4 != 0) {
    in_RDI[1].super_re_compiled_pattern_base.machine.init = 1;
    *(undefined4 *)&in_RDI->tuples[0].field_0x24 = 0;
    b = in_RDI;
    utf8_ptr::utf8_ptr(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    sVar2 = vmb_get_len((char *)0x2ad364);
    lVar4 = (long)in_EDX;
    pcVar3 = (char *)vmb_get_len((char *)0x2ad382);
    if ((in_RDI->tuples[0].next_state_2 & 2U) == 0) {
      while (pcVar3 <= (char *)(sVar2 - lVar4)) {
        __s1 = utf8_ptr::getptr(&local_28);
        iVar1 = memcmp(__s1,(void *)(*(long *)&(in_RDI->super_re_compiled_pattern_base).tuple_cnt +
                                    2),(size_t)pcVar3);
        if (iVar1 == 0) {
          *(int *)&in_RDI->tuples[0].field_0x24 = (int)pcVar3;
          pcVar3 = utf8_ptr::getptr(&local_28);
          *(int *)&in_RDI->tuples[0].flags = (int)pcVar3 - ((int)in_RSI + 2);
          return;
        }
        utf8_ptr::inc(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      }
    }
    else {
      while (pcVar3 <= (char *)(sVar2 - lVar4)) {
        in_stack_ffffffffffffffa8 =
             (char *)(*(long *)&(in_RDI->super_re_compiled_pattern_base).tuple_cnt + 2);
        in_stack_ffffffffffffffb0 = pcVar3;
        utf8_ptr::getptr(&local_28);
        iVar1 = t3_compare_case_fold
                          (in_stack_00000008,unaff_retaddr,(char *)b,in_RSI,
                           (size_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
        if (iVar1 == 0) {
          pcVar3 = utf8_ptr::getptr(&local_28);
          *(int *)&in_RDI->tuples[0].flags = (int)pcVar3 - ((int)in_RSI + 2);
          *(int *)&in_RDI->tuples[0].field_0x24 = (int)in_stack_ffffffffffffffc0;
          return;
        }
        utf8_ptr::inc(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      }
    }
    *(undefined4 *)&in_RDI->tuples[0].flags = 0xffffffff;
  }
  if ((in_RDI->super_re_compiled_pattern_base).machine == (re_machine)0x0) {
    *(undefined4 *)&in_RDI->tuples[0].flags = 0xffffffff;
  }
  else {
    result_len = (int *)(in_RSI + 2);
    vmb_get_len((char *)0x2ad511);
    iVar1 = CRegexSearcherSimple::search_for_pattern
                      (in_stack_ffffffffffffffc0,in_RDI,in_stack_ffffffffffffffb0,
                       in_stack_ffffffffffffffa8,local_20,result_len);
    *(int *)&in_RDI->tuples[0].flags = iVar1;
    if (-1 < *(int *)&in_RDI->tuples[0].flags) {
      *(int *)&in_RDI->tuples[0].flags = in_EDX + *(int *)&in_RDI->tuples[0].flags;
    }
  }
  in_RDI[1].super_re_compiled_pattern_base.machine.init = 1;
  return;
}

Assistant:

void search(VMG_ const char *str, int start_idx, const char *last_str)
    {
        /* if we have a pattern, search for it */
        if (pat_str != 0)
        {
            /* 
             *   whether or not we find a match, the search will be valid
             *   when we return 
             */
            match_valid = TRUE;
            match_len = 0;

            /* set up a pointer to the current position */
            utf8_ptr p((char *)str + VMB_LEN + start_idx);

            /* figure the number of bytes left in the string */
            size_t rem = vmb_get_len(str) - start_idx;

            /* note the length of the search string */
            size_t pat_len = vmb_get_len(pat_str);

            /* scan for a match, according to case sensitivity */
            if (!(flags & VMBIFTADS_REPLACE_NOCASE))
            {
                /* case sensitive - scan for a match */
                for ( ; rem >= pat_len ; p.inc(&rem))
                {
                    /* no case folding, so simply compare byte by byte */
                    if (memcmp(p.getptr(), pat_str + VMB_LEN, pat_len) == 0)
                    {
                        /* success - remember the match length and position */
                        match_len = pat_len;
                        match_idx = p.getptr() - (str + VMB_LEN);

                        /* we're done */
                        return;
                    }
                }
            }
            else
            {
                /* case-insensitive - scan for a match */
                for ( ; rem >= pat_len ; p.inc(&rem))
                {
                    /* compare with case folding */
                    size_t ml;
                    if (t3_compare_case_fold(
                        pat_str + VMB_LEN, pat_len,
                        p.getptr(), rem, &ml) == 0)
                    {
                        /* success - set the match index, and we're done */
                        match_idx = p.getptr() - (str + VMB_LEN);
                        match_len = ml;
                        return;
                    }
                }
            }

            /* we didn't a match - set the match index to so indicate */
            match_idx = -1;
        }
        if (pat != 0)
        {
            /* search for the regular expression */
            match_idx = s->search_for_pattern(
                pat, str + VMB_LEN, last_str,
                vmb_get_len(str) - start_idx, &match_len);

            /* if we found it, adjust to the absolute offset in the string */
            if (match_idx >= 0)
                match_idx += start_idx;
        }
        else
        {
            /* no pattern -> no match */
            match_idx = -1;
        }

        /* whether or not we matched, our result is now valid */
        match_valid = TRUE;
    }